

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_status_t linear_hash_delete(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  ion_key_size_t iVar3;
  int iVar4;
  FILE *pFVar5;
  size_t __size;
  ion_dictionary_compare_t p_Var6;
  ion_byte_t *piVar7;
  ion_byte_t *piVar8;
  ion_byte_t *piVar9;
  ion_byte_t *record_loc_00;
  ion_fpos_t iVar10;
  undefined8 bucket_loc_00;
  byte bVar11;
  char cVar12;
  ion_err_t iVar13;
  ion_byte_t *piVar14;
  long lVar15;
  bool bVar16;
  ion_byte_t aiStack_a0 [16];
  ion_byte_t *local_90;
  ion_fpos_t swap_record_loc;
  ion_boolean_t terminal;
  ion_byte_t *piStack_80;
  ion_byte_t terminal_record_status;
  ion_byte_t *terminal_record_value;
  ion_byte_t *terminal_record_key;
  ion_fpos_t record_loc;
  ion_fpos_t record_offset;
  ion_byte_t *records;
  int i;
  ion_byte_t record_status;
  ion_byte_t *record_value;
  ion_byte_t *record_key;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  int bucket_idx;
  linear_hash_table_t *linear_hash_local;
  ion_byte_t *key_local;
  ion_status_t status;
  
  aiStack_a0[0] = '\v';
  aiStack_a0[1] = 0xf4;
  aiStack_a0[2] = '\x11';
  aiStack_a0[3] = '\0';
  aiStack_a0[4] = '\0';
  aiStack_a0[5] = '\0';
  aiStack_a0[6] = '\0';
  aiStack_a0[7] = '\0';
  bucket_loc._4_4_ = insert_hash_to_bucket(key,linear_hash);
  if (bucket_loc._4_4_ < linear_hash->next_split) {
    aiStack_a0[0] = '\'';
    aiStack_a0[1] = 0xf4;
    aiStack_a0[2] = '\x11';
    aiStack_a0[3] = '\0';
    aiStack_a0[4] = '\0';
    aiStack_a0[5] = '\0';
    aiStack_a0[6] = '\0';
    aiStack_a0[7] = '\0';
    bucket_loc._4_4_ = hash_to_bucket(key,linear_hash);
  }
  aiStack_a0[0] = '6';
  aiStack_a0[1] = 0xf4;
  aiStack_a0[2] = '\x11';
  aiStack_a0[3] = '\0';
  aiStack_a0[4] = '\0';
  aiStack_a0[5] = '\0';
  aiStack_a0[6] = '\0';
  aiStack_a0[7] = '\0';
  bucket.overflow_location = bucket_idx_to_ion_fpos_t(bucket_loc._4_4_,linear_hash);
  aiStack_a0[0] = 'K';
  aiStack_a0[1] = 0xf4;
  aiStack_a0[2] = '\x11';
  aiStack_a0[3] = '\0';
  aiStack_a0[4] = '\0';
  aiStack_a0[5] = '\0';
  aiStack_a0[6] = '\0';
  aiStack_a0[7] = '\0';
  bVar11 = linear_hash_get_bucket
                     (bucket.overflow_location,(linear_hash_bucket_t *)&record_key,linear_hash);
  key_local = (ion_byte_t *)(ulong)bVar11;
  if (bVar11 == 0) {
    record_value = aiStack_a0 +
                   (8 - ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    _i = record_value + -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    records._7_1_ = '\0';
    piVar14 = _i + -(linear_hash->record_total_size * (long)linear_hash->records_per_bucket + 0xfU &
                    0xfffffffffffffff0);
    lVar15 = linear_hash->record_total_size;
    iVar1 = linear_hash->records_per_bucket;
    record_offset = (ion_fpos_t)piVar14;
    piVar14[-8] = 0xda;
    piVar14[-7] = 0xf4;
    piVar14[-6] = '\x11';
    piVar14[-5] = '\0';
    piVar14[-4] = '\0';
    piVar14[-3] = '\0';
    piVar14[-2] = '\0';
    piVar14[-1] = '\0';
    memset(piVar14,0,lVar15 * iVar1);
    record_loc = 0;
    terminal_record_value =
         piVar14 + -((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    piVar14 = terminal_record_value +
              -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    swap_record_loc._7_1_ = '\0';
    linear_hash->last_cache_idx = 0;
    swap_record_loc._6_1_ = '\0';
    piStack_80 = piVar14;
LAB_0011f52f:
    do {
      if (swap_record_loc._6_1_ != '\0') {
        bVar16 = key_local._4_4_ == 0;
        if (bVar16) {
          key_local = (ion_byte_t *)CONCAT71(key_local._1_7_,1);
          return (ion_status_t)key_local;
        }
        key_local = (ion_byte_t *)((ulong)key_local._1_7_ << 8);
        return (ion_status_t)key_local;
      }
      terminal_record_key = (ion_byte_t *)(bucket.overflow_location + 0x10);
      pFVar5 = (FILE *)linear_hash->database;
      lVar15 = bucket.overflow_location + 0x10;
      piVar14[-8] = '_';
      piVar14[-7] = 0xf5;
      piVar14[-6] = '\x11';
      piVar14[-5] = '\0';
      piVar14[-4] = '\0';
      piVar14[-3] = '\0';
      piVar14[-2] = '\0';
      piVar14[-1] = '\0';
      fseek(pFVar5,lVar15,0);
      iVar10 = record_offset;
      __size = linear_hash->record_total_size;
      iVar1 = linear_hash->records_per_bucket;
      pFVar5 = (FILE *)linear_hash->database;
      piVar14[-8] = 0x80;
      piVar14[-7] = 0xf5;
      piVar14[-6] = '\x11';
      piVar14[-5] = '\0';
      piVar14[-4] = '\0';
      piVar14[-3] = '\0';
      piVar14[-2] = '\0';
      piVar14[-1] = '\0';
      fread((void *)iVar10,__size,(long)iVar1,pFVar5);
      for (records._0_4_ = 0; bucket_loc_00 = bucket._0_8_, piVar9 = record_value,
          (int)records < record_key._4_4_; records._0_4_ = (int)records + 1) {
        records._7_1_ = *(char *)(record_offset + record_loc);
        lVar15 = record_offset + record_loc;
        iVar1 = (linear_hash->super).record.key_size;
        piVar14[-8] = 0xbe;
        piVar14[-7] = 0xf5;
        piVar14[-6] = '\x11';
        piVar14[-5] = '\0';
        piVar14[-4] = '\0';
        piVar14[-3] = '\0';
        piVar14[-2] = '\0';
        piVar14[-1] = '\0';
        memcpy(piVar9,(void *)(lVar15 + 1),(long)iVar1);
        piVar9 = _i;
        lVar15 = record_offset + record_loc;
        iVar1 = (linear_hash->super).record.key_size;
        iVar2 = (linear_hash->super).record.value_size;
        piVar14[-8] = 0xe6;
        piVar14[-7] = 0xf5;
        piVar14[-6] = '\x11';
        piVar14[-5] = '\0';
        piVar14[-4] = '\0';
        piVar14[-3] = '\0';
        piVar14[-2] = '\0';
        piVar14[-1] = '\0';
        memcpy(piVar9,(void *)(lVar15 + 1 + (long)iVar1),(long)iVar2);
        piVar9 = record_value;
        if (records._7_1_ != '\0') {
          p_Var6 = (linear_hash->super).compare;
          iVar3 = (linear_hash->super).record.key_size;
          piVar14[-8] = '\f';
          piVar14[-7] = 0xf6;
          piVar14[-6] = '\x11';
          piVar14[-5] = '\0';
          piVar14[-4] = '\0';
          piVar14[-3] = '\0';
          piVar14[-2] = '\0';
          piVar14[-1] = '\0';
          cVar12 = (*p_Var6)(piVar9,key,iVar3);
          piVar9 = _i;
          if (cVar12 == '\0') {
            piVar7 = linear_hash->cache;
            iVar1 = linear_hash->last_cache_idx;
            iVar2 = (linear_hash->super).record.value_size;
            iVar4 = (linear_hash->super).record.value_size;
            piVar14[-8] = 'E';
            piVar14[-7] = 0xf6;
            piVar14[-6] = '\x11';
            piVar14[-5] = '\0';
            piVar14[-4] = '\0';
            piVar14[-3] = '\0';
            piVar14[-2] = '\0';
            piVar14[-1] = '\0';
            memcpy(piVar7 + iVar1 * iVar2,piVar9,(long)iVar4);
            piVar7 = terminal_record_value;
            piVar9 = piStack_80;
            linear_hash->last_cache_idx = linear_hash->last_cache_idx + 1;
            local_90 = terminal_record_key;
            piVar14[-8] = '|';
            piVar14[-7] = 0xf6;
            piVar14[-6] = '\x11';
            piVar14[-5] = '\0';
            piVar14[-4] = '\0';
            piVar14[-3] = '\0';
            piVar14[-2] = '\0';
            piVar14[-1] = '\0';
            linear_hash_get_bucket_swap_record
                      (bucket_loc._4_4_,(ion_fpos_t *)&local_90,piVar7,piVar9,
                       (ion_byte_t *)((long)&swap_record_loc + 7),linear_hash);
            while( true ) {
              piVar7 = key_local;
              piVar9 = terminal_record_value;
              p_Var6 = (linear_hash->super).compare;
              iVar3 = (linear_hash->super).record.key_size;
              piVar14[-8] = 0x95;
              piVar14[-7] = 0xf6;
              piVar14[-6] = '\x11';
              piVar14[-5] = '\0';
              piVar14[-4] = '\0';
              piVar14[-3] = '\0';
              piVar14[-2] = '\0';
              piVar14[-1] = '\0';
              cVar12 = (*p_Var6)(piVar9,key,iVar3);
              piVar9 = piStack_80;
              if (cVar12 != '\0') break;
              piVar8 = linear_hash->cache;
              iVar1 = linear_hash->last_cache_idx;
              iVar2 = (linear_hash->super).record.value_size;
              iVar4 = (linear_hash->super).record.value_size;
              piVar14[-8] = 0xce;
              piVar14[-7] = 0xf6;
              piVar14[-6] = '\x11';
              piVar14[-5] = '\0';
              piVar14[-4] = '\0';
              piVar14[-3] = '\0';
              piVar14[-2] = '\0';
              piVar14[-1] = '\0';
              memcpy(piVar8 + iVar1 * iVar2,piVar9,(long)iVar4);
              piVar8 = terminal_record_value;
              piVar9 = piStack_80;
              linear_hash->last_cache_idx = linear_hash->last_cache_idx + 1;
              if (terminal_record_key == local_90) break;
              piVar14[-8] = '\t';
              piVar14[-7] = 0xf7;
              piVar14[-6] = '\x11';
              piVar14[-5] = '\0';
              piVar14[-4] = '\0';
              piVar14[-3] = '\0';
              piVar14[-2] = '\0';
              piVar14[-1] = '\0';
              linear_hash_get_bucket_swap_record
                        (bucket_loc._4_4_,(ion_fpos_t *)&local_90,piVar8,piVar9,
                         (ion_byte_t *)((long)&swap_record_loc + 7),linear_hash);
              if (swap_record_loc._7_1_ == '\0') break;
              key_local = (ion_byte_t *)CONCAT44(key_local._4_4_ + 1,key_local._0_4_);
            }
            record_loc_00 = terminal_record_key;
            piVar8 = terminal_record_value;
            piVar9 = piStack_80;
            if (terminal_record_key != local_90) {
              piVar14[-8] = 'H';
              piVar14[-7] = 0xf7;
              piVar14[-6] = '\x11';
              piVar14[-5] = '\0';
              piVar14[-4] = '\0';
              piVar14[-3] = '\0';
              piVar14[-2] = '\0';
              piVar14[-1] = '\0';
              linear_hash_write_record
                        ((ion_fpos_t)record_loc_00,piVar8,piVar9,
                         (ion_byte_t *)((long)&swap_record_loc + 7),linear_hash);
            }
            iVar10 = bucket.overflow_location;
            key_local = (ion_byte_t *)CONCAT44(key_local._4_4_ + 1,key_local._0_4_);
            piVar9 = key_local;
            key_local._0_1_ = (char)piVar7;
            if ((char)key_local != '\0') {
              return (ion_status_t)piVar9;
            }
            piVar14[-8] = 'p';
            piVar14[-7] = 0xf7;
            piVar14[-6] = '\x11';
            piVar14[-5] = '\0';
            piVar14[-4] = '\0';
            piVar14[-3] = '\0';
            piVar14[-2] = '\0';
            piVar14[-1] = '\0';
            linear_hash_get_bucket(iVar10,(linear_hash_bucket_t *)&record_key,linear_hash);
            key_local = piVar9;
          }
        }
        terminal_record_key = terminal_record_key + linear_hash->record_total_size;
        record_loc = linear_hash->record_total_size + record_loc;
      }
      if (bucket._0_8_ == -1) {
        swap_record_loc._6_1_ = '\x01';
        goto LAB_0011f52f;
      }
      record_loc = 0;
      bucket.overflow_location._0_4_ = bucket.idx;
      bucket.overflow_location._4_4_ = bucket.record_count;
      piVar14[-8] = 0xce;
      piVar14[-7] = 0xf7;
      piVar14[-6] = '\x11';
      piVar14[-5] = '\0';
      piVar14[-4] = '\0';
      piVar14[-3] = '\0';
      piVar14[-2] = '\0';
      piVar14[-1] = '\0';
      iVar13 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)&record_key,linear_hash)
      ;
      key_local = (ion_byte_t *)CONCAT71(key_local._1_7_,iVar13);
    } while (iVar13 == '\0');
  }
  return (ion_status_t)key_local;
}

Assistant:

ion_status_t
linear_hash_delete(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int i;

	ion_byte_t *records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t	record_offset = 0;
	ion_fpos_t	record_loc;

	/* memory allocated to transfer the terminal records to delete location for swap on delete */
	ion_byte_t	*terminal_record_key	= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*terminal_record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	terminal_record_status	= linear_hash_record_status_empty;

	linear_hash->last_cache_idx = 0;

	ion_boolean_t terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < bucket.record_count; i++) {
			/* read in record */
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					/* TODO Create wrapper methods and implement proper error propagation */
					/* cache the record being deleted's value */
					memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, record_value, linear_hash->super.record.value_size);
					linear_hash->last_cache_idx++;

					/* store the record_loc in a write back paramter that is used before being overwritten */
					ion_fpos_t swap_record_loc = record_loc;

					/* obtain the swap record */
					linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

					/* delete all swap records which are going to be deleted anyways */
					while (linear_hash->super.compare(terminal_record_key, key, linear_hash->super.record.key_size) == 0) {
						memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, terminal_record_value, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						/* if we are not trying to swap a record with itself */
						if (record_loc == swap_record_loc) {
							/* write the swapped record to record_loc */
							break;
						}

						linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

						if (terminal_record_status == linear_hash_record_status_empty) {
							break;
						}

						status.count++;
					}

					/* if we are not trying to swap a record with itself */
					if (record_loc != swap_record_loc) {
						/* write the swapped record to record_loc */
						linear_hash_write_record(record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);
					}

					status.count++;

					if (status.error != err_ok) {
						return status;
					}

					linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
				}
			}

			record_loc		+= linear_hash->record_total_size;
			record_offset	+= linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			record_offset	= 0;
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}